

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int int32_put(cram_block *b,int32_t val)

{
  size_t sVar1;
  int iVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  double local_20;
  uchar cp [4];
  int32_t val_local;
  cram_block *b_local;
  
  while (b->alloc <= b->byte + 4) {
    if (b->alloc == 0) {
      local_20 = 1024.0;
    }
    else {
      sVar1 = b->alloc;
      auVar4._8_4_ = (int)(sVar1 >> 0x20);
      auVar4._0_8_ = sVar1;
      auVar4._12_4_ = 0x45300000;
      local_20 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
    }
    b->alloc = (long)local_20 | (long)(local_20 - 9.223372036854776e+18) & (long)local_20 >> 0x3f;
    puVar3 = (uchar *)realloc(b->data,b->alloc);
    b->data = puVar3;
  }
  *(int32_t *)(b->data + b->byte) = val;
  b->byte = b->byte + 4;
  iVar2 = -1;
  if (b->data != (uchar *)0x0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int int32_put(cram_block *b, int32_t val) {
    unsigned char cp[4];
    cp[0] = ( val      & 0xff);
    cp[1] = ((val>>8)  & 0xff);
    cp[2] = ((val>>16) & 0xff);
    cp[3] = ((val>>24) & 0xff);

    BLOCK_APPEND(b, cp, 4);
    return b->data ? 0 : -1;
}